

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::ConversionExpression::convert
          (ConstantValue *__return_storage_ptr__,ConversionExpression *this,EvalContext *context,
          Type *from,Type *to,SourceRange sourceRange,ConstantValue *value,
          ConversionKind conversionKind)

{
  SymbolKind SVar1;
  SVQueue *pSVar2;
  bool bVar3;
  bool bVar4;
  bitwidth_t bVar5;
  int iVar6;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar7;
  ConstantRange CVar8;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  Type *pTVar10;
  int *piVar11;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar12;
  Diagnostic *pDVar13;
  Type *pTVar14;
  logic_error *plVar15;
  long *plVar16;
  int iVar17;
  size_type *psVar18;
  long *plVar19;
  SourceRange range;
  SourceRange sourceRange_00;
  SVQueue result;
  undefined4 in_stack_fffffffffffffe6c;
  undefined1 in_stack_fffffffffffffe70;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  _Map_pointer local_120;
  SVQueue local_118;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*> local_78;
  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*> local_58;
  
  if (*(char *)((long)sourceRange.startLoc + 0x20) == '\0') {
LAB_003a714b:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\0';
    return __return_storage_ptr__;
  }
  bVar3 = Type::isMatching((Type *)context,from);
  if (!bVar3) {
    if ((sourceRange.endLoc._0_4_ == 4) || (sourceRange.endLoc._0_4_ == 2)) {
      sourceRange_00.endLoc = (SourceLocation)this;
      sourceRange_00.startLoc = (SourceLocation)value;
      Bitstream::evaluateCast
                (__return_storage_ptr__,(Bitstream *)from,(Type *)sourceRange.startLoc,
                 (ConstantValue *)to,sourceRange_00,
                 (EvalContext *)
                 CONCAT44(in_stack_fffffffffffffe6c,(uint)(sourceRange.endLoc._0_4_ == 2)),
                 (bool)in_stack_fffffffffffffe70);
      return __return_storage_ptr__;
    }
    bVar3 = Type::isIntegral(from);
    if (bVar3) {
      if ((sourceRange.endLoc._0_4_ == 1) &&
         (*(char *)((long)sourceRange.startLoc + 0x20) == '\x01')) {
        pvVar7 = std::
                 get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                           ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)sourceRange.startLoc);
        bVar3 = Type::isSigned(from);
        (pvVar7->super_SVIntStorage).signFlag = bVar3;
      }
      bVar5 = Type::getBitWidth(from);
      bVar3 = Type::isSigned(from);
      bVar4 = Type::isFourState(from);
      ConstantValue::convertToInt
                (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc,bVar5,bVar3,bVar4);
      return __return_storage_ptr__;
    }
    pTVar14 = from->canonical;
    if (pTVar14 == (Type *)0x0) {
      Type::resolveCanonical(from);
      pTVar14 = from->canonical;
    }
    SVar1 = (pTVar14->super_Symbol).kind;
    if (SVar1 == StringType) {
      ConstantValue::convertToStr(__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
      return __return_storage_ptr__;
    }
    if (SVar1 == FloatingType) {
      bVar5 = Type::getBitWidth(from);
      if (bVar5 == 0x40) {
        ConstantValue::convertToReal(__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
        return __return_storage_ptr__;
      }
      if (bVar5 == 0x20) {
        ConstantValue::convertToShortReal
                  (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
        return __return_storage_ptr__;
      }
      plVar15 = (logic_error *)__cxa_allocate_exception(0x10);
      local_180[0] = local_170;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                 ,"");
      plVar16 = (long *)std::__cxx11::string::append((char *)local_180);
      local_160._M_dataplus._M_p = (pointer)*plVar16;
      psVar18 = (size_type *)(plVar16 + 2);
      if ((size_type *)local_160._M_dataplus._M_p == psVar18) {
        local_160.field_2._M_allocated_capacity = *psVar18;
        local_160.field_2._8_8_ = plVar16[3];
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar18;
      }
      local_160._M_string_length = plVar16[1];
      *plVar16 = (long)psVar18;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      std::__cxx11::to_string(&local_b8,0x305);
      std::operator+(&local_98,&local_160,&local_b8);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_98);
      local_140 = (long *)*plVar16;
      plVar19 = plVar16 + 2;
      if (local_140 == plVar19) {
        local_130 = *plVar19;
        lStack_128 = plVar16[3];
        local_140 = &local_130;
      }
      else {
        local_130 = *plVar19;
      }
      local_138 = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_140);
      local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)*plVar16;
      plVar19 = plVar16 + 2;
      if (local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_map == (_Map_pointer)plVar19) {
        local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
        local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_start._M_first = (_Elt_pointer)plVar16[3];
        local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_map =
             &local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
              super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur;
      }
      else {
        local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
      }
      local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
      super__Deque_impl_data._M_map_size = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      std::logic_error::logic_error(plVar15,(string *)&local_118);
      __cxa_throw(plVar15,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    bVar3 = Type::isUnpackedArray(from);
    if ((bVar3) && (bVar3 = Type::isUnpackedArray((Type *)context), bVar3)) {
      bVar3 = Type::hasFixedRange(from);
      if ((bVar3) && (bVar3 = Type::hasFixedRange((Type *)context), bVar3)) {
        assert::assertFailed
                  ("!to.hasFixedRange() || !from.hasFixedRange()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                   ,0x30f,
                   "static ConstantValue slang::ast::ConversionExpression::convert(EvalContext &, const Type &, const Type &, SourceRange, ConstantValue &&, ConversionKind)"
                  );
      }
      bVar3 = Type::hasFixedRange(from);
      if (bVar3) {
        local_120 = (_Map_pointer)ConstantValue::size((ConstantValue *)sourceRange.startLoc);
        CVar8 = Type::getFixedRange(from);
        iVar6 = CVar8.left - CVar8.right;
        iVar17 = -iVar6;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        if (local_120 != (_Map_pointer)(ulong)(iVar17 + 1)) {
          range.endLoc = (SourceLocation)value;
          range.startLoc = (SourceLocation)to;
          pDVar13 = EvalContext::addDiag((EvalContext *)this,(DiagCode)0x9000c,range);
          pDVar13 = ast::operator<<(pDVar13,(Type *)context);
          local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_map = local_120;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
          ::emplace_back<unsigned_long>(&pDVar13->args,(unsigned_long *)&local_118);
          ast::operator<<(pDVar13,from);
          goto LAB_003a714b;
        }
      }
      pTVar14 = from->canonical;
      if (pTVar14 == (Type *)0x0) {
        Type::resolveCanonical(from);
        pTVar14 = from->canonical;
      }
      if ((pTVar14->super_Symbol).kind != QueueType) {
        piVar11 = *(int **)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                            firstElement + 8);
        if (piVar11 == (int *)0x0) {
          Type::resolveCanonical((Type *)context);
          piVar11 = *(int **)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>
                              .firstElement + 8);
        }
        if (*piVar11 == 0xf) {
          pvVar12 = std::
                    get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                *)sourceRange.startLoc);
          pSVar2 = pvVar12->ptr;
          local_58._M_cur =
               (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
          local_58._M_first =
               (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_start._M_first;
          local_58._M_last =
               (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
          local_58._M_node =
               (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
          local_78._M_cur =
               (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_78._M_first =
               (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_first;
          local_78._M_last =
               (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_last;
          local_78._M_node =
               (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node;
          std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
          vector<std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>,void>
                    ((vector<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)&local_118
                     ,&local_58,&local_78,(allocator_type *)&local_140);
          *(_Map_pointer *)
           &(__return_storage_ptr__->value).
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               = local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Deque_impl_data._M_map;
          *(size_t *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 8) = local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                  .super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_map_size;
          *(_Elt_pointer *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x10) = local_118.
                     super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                     super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_cur;
          local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_map = (_Map_pointer)0x0;
          local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_map_size = 0;
          local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x20) = '\x05';
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                    ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                     &local_118);
          return __return_storage_ptr__;
        }
        pTVar14 = from->canonical;
        if (pTVar14 == (Type *)0x0) {
          Type::resolveCanonical(from);
          pTVar14 = from->canonical;
        }
        if ((pTVar14->super_Symbol).kind != QueueType) goto LAB_003a6cb0;
      }
      piVar11 = *(int **)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                          firstElement + 8);
      if (piVar11 == (int *)0x0) {
        Type::resolveCanonical((Type *)context);
        piVar11 = *(int **)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                            firstElement + 8);
      }
      if (*piVar11 != 0xf) {
        pvVar9 = std::
                 get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                           ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)sourceRange.startLoc);
        SVQueue::deque<slang::ConstantValue*,void>
                  (&local_118,
                   (pvVar9->
                   super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                   (pvVar9->
                   super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                   _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_140);
        pTVar14 = from->canonical;
        if (pTVar14 == (Type *)0x0) {
          Type::resolveCanonical(from);
          pTVar14 = from->canonical;
        }
        if ((pTVar14->super_Symbol).kind == QueueType) {
          local_118.maxBound = (uint32_t)pTVar14[1].super_Symbol.name._M_len;
          SVQueue::resizeToBound(&local_118);
          ConstantValue::ConstantValue(__return_storage_ptr__,&local_118);
          std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
                    (&local_118.
                      super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
          return __return_storage_ptr__;
        }
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::QueueType]");
      }
    }
    else {
      bVar3 = Type::isByteArray(from);
      if (bVar3) {
        pTVar14 = from->canonical;
        if (pTVar14 == (Type *)0x0) {
          Type::resolveCanonical(from);
          pTVar14 = from->canonical;
        }
        pTVar10 = Type::getArrayElementType(pTVar14);
        bVar3 = Type::isSigned(pTVar10);
        pTVar10 = pTVar14->canonical;
        if (pTVar10 == (Type *)0x0) {
          Type::resolveCanonical(pTVar14);
          pTVar10 = pTVar14->canonical;
        }
        if ((pTVar10->super_Symbol).kind == QueueType) {
          ConstantValue::convertToByteQueue
                    (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc,bVar3);
          return __return_storage_ptr__;
        }
        bVar4 = Type::hasFixedRange(pTVar14);
        bVar5 = 0;
        if (bVar4) {
          if ((pTVar14->super_Symbol).kind != FixedSizeUnpackedArrayType) {
            assert::assertFailed
                      ("T::isKind(kind)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                       ,0xc4,
                       "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::FixedSizeUnpackedArrayType]"
                      );
          }
          iVar6 = (int)pTVar14[1].super_Symbol.name._M_len -
                  *(int *)((long)&pTVar14[1].super_Symbol.name._M_len + 4);
          iVar17 = -iVar6;
          if (0 < iVar6) {
            iVar17 = iVar6;
          }
          bVar5 = iVar17 + 1;
        }
        ConstantValue::convertToByteArray
                  (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc,bVar5,bVar3);
        return __return_storage_ptr__;
      }
      piVar11 = *(int **)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                          firstElement + 8);
      if (piVar11 == (int *)0x0) {
        Type::resolveCanonical((Type *)context);
        piVar11 = *(int **)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                            firstElement + 8);
      }
      if (*piVar11 != 0x17) {
        plVar15 = (logic_error *)__cxa_allocate_exception(0x10);
        local_180[0] = local_170;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_180,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                   ,"");
        plVar16 = (long *)std::__cxx11::string::append((char *)local_180);
        local_160._M_dataplus._M_p = (pointer)*plVar16;
        psVar18 = (size_type *)(plVar16 + 2);
        if ((size_type *)local_160._M_dataplus._M_p == psVar18) {
          local_160.field_2._M_allocated_capacity = *psVar18;
          local_160.field_2._8_8_ = plVar16[3];
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar18;
        }
        local_160._M_string_length = plVar16[1];
        *plVar16 = (long)psVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        std::__cxx11::to_string(&local_b8,0x33f);
        std::operator+(&local_98,&local_160,&local_b8);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_140 = (long *)*plVar16;
        plVar19 = plVar16 + 2;
        if (local_140 == plVar19) {
          local_130 = *plVar19;
          lStack_128 = plVar16[3];
          local_140 = &local_130;
        }
        else {
          local_130 = *plVar19;
        }
        local_138 = plVar16[1];
        *plVar16 = (long)plVar19;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_140);
        local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)*plVar16;
        plVar19 = plVar16 + 2;
        if (local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
            super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
            super__Deque_impl_data._M_map == (_Map_pointer)plVar19) {
          local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
          local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_first = (_Elt_pointer)plVar16[3];
          local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_map =
               &local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
        }
        else {
          local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
        }
        local_118.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_map_size = plVar16[1];
        *plVar16 = (long)plVar19;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        std::logic_error::logic_error(plVar15,(string *)&local_118);
        __cxa_throw(plVar15,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
LAB_003a6cb0:
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)__return_storage_ptr__,
                    (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)sourceRange.startLoc);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ConversionExpression::convert(EvalContext& context, const Type& from, const Type& to,
                                            SourceRange sourceRange, ConstantValue&& value,
                                            ConversionKind conversionKind) {
    if (!value)
        return nullptr;

    if (from.isMatching(to))
        return std::move(value);

    if (conversionKind == ConversionKind::BitstreamCast ||
        conversionKind == ConversionKind::StreamingConcat) {
        return Bitstream::evaluateCast(to, std::move(value), sourceRange, context,
                                       conversionKind == ConversionKind::StreamingConcat);
    }

    if (to.isIntegral()) {
        // [11.8.2] last bullet says: the operand shall be sign-extended only if the propagated type
        // is signed. It is different from [11.8.3] ConstantValue::convertToInt uses.
        // ConversionKind::Propagated marked in Expression::PropagationVisitor
        if (conversionKind == ConversionKind::Propagated && value.isInteger())
            value.integer().setSigned(to.isSigned());
        return value.convertToInt(to.getBitWidth(), to.isSigned(), to.isFourState());
    }

    if (to.isFloating()) {
        switch (to.getBitWidth()) {
            case 32:
                return value.convertToShortReal();
            case 64:
                return value.convertToReal();
            default:
                ASSUME_UNREACHABLE;
        }
    }

    if (to.isString())
        return value.convertToStr();

    if (to.isUnpackedArray() && from.isUnpackedArray()) {
        // Conversion to a dynamic array just resizes. Conversion to a fixed array
        // must have the same number of elements in the source.
        ASSERT(!to.hasFixedRange() || !from.hasFixedRange());
        if (to.hasFixedRange()) {
            size_t size = value.size();
            if (size != to.getFixedRange().width()) {
                context.addDiag(diag::ConstEvalDynamicToFixedSize, sourceRange)
                    << from << size << to;
                return nullptr;
            }
        }

        if (!to.isQueue() && from.isQueue()) {
            // Convert from queue to vector.
            auto& q = *value.queue();
            return std::vector(q.begin(), q.end());
        }

        if (to.isQueue() && !from.isQueue()) {
            // Convert from vector to queue.
            auto elems = value.elements();
            SVQueue result(elems.begin(), elems.end());
            result.maxBound = to.getCanonicalType().as<QueueType>().maxBound;
            result.resizeToBound();
            return result;
        }

        return std::move(value);
    }

    if (to.isByteArray()) {
        auto& ct = to.getCanonicalType();
        bool isSigned = ct.getArrayElementType()->isSigned();
        if (ct.isQueue())
            return value.convertToByteQueue(isSigned);

        bitwidth_t size;
        if (ct.hasFixedRange())
            size = ct.as<FixedSizeUnpackedArrayType>().range.width();
        else
            size = 0; // dynamic array use string size

        return value.convertToByteArray(size, isSigned);
    }

    // Null can be assigned to various destination types. It's ok to just
    // keep propagating the null value.
    if (from.isNull())
        return std::move(value);

    ASSUME_UNREACHABLE;
}